

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_oset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  OBJ_DATA *pOVar4;
  short sVar5;
  char arg2 [4608];
  char arg3 [4608];
  char arg1 [4608];
  char local_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  smash_tilde(argument);
  pcVar3 = one_argument(argument,local_1228);
  pcVar3 = one_argument(pcVar3,local_3628);
  strcpy(local_2428,pcVar3);
  if (((local_1228[0] == '\0') || (local_3628[0] == '\0')) || (local_2428[0] == '\0')) {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  set obj <object> <field> <value>\n\r",ch);
    send_to_char("  Field being one of:\n\r",ch);
    send_to_char("    value0 value1 value2 value3 value4 (v1-v4)\n\r",ch);
    pcVar3 = "    extra wear level weight cost timer\n\r";
  }
  else {
    pOVar4 = get_obj_world(ch,local_1228);
    if (pOVar4 != (OBJ_DATA *)0x0) {
      iVar2 = atoi(local_2428);
      bVar1 = str_cmp(local_3628,"value0");
      if ((!bVar1) || (bVar1 = str_cmp(local_3628,"v0"), !bVar1)) {
        pOVar4->value[0] = iVar2;
        return;
      }
      bVar1 = str_cmp(local_3628,"value1");
      if ((!bVar1) || (bVar1 = str_cmp(local_3628,"v1"), !bVar1)) {
        pOVar4->value[1] = iVar2;
        return;
      }
      bVar1 = str_cmp(local_3628,"value2");
      if ((!bVar1) || (bVar1 = str_cmp(local_3628,"v2"), !bVar1)) {
        pOVar4->value[2] = iVar2;
        return;
      }
      bVar1 = str_cmp(local_3628,"value3");
      if ((bVar1) && (bVar1 = str_cmp(local_3628,"v3"), bVar1)) {
        bVar1 = str_cmp(local_3628,"value4");
        if ((!bVar1) || (bVar1 = str_cmp(local_3628,"v4"), !bVar1)) {
          pOVar4->value[4] = iVar2;
          return;
        }
        bVar1 = str_prefix(local_3628,"level");
        sVar5 = (short)iVar2;
        if (!bVar1) {
          pOVar4->level = sVar5;
          return;
        }
        bVar1 = str_prefix(local_3628,"weight");
        if (bVar1) {
          bVar1 = str_prefix(local_3628,"cost");
          if (!bVar1) {
            pOVar4->cost = iVar2;
            return;
          }
          bVar1 = str_prefix(local_3628,"timer");
          if (bVar1) {
            do_oset(ch,"");
            return;
          }
          pOVar4->timer = sVar5;
          return;
        }
        pOVar4->weight = sVar5;
        return;
      }
      pOVar4->value[3] = iVar2;
      return;
    }
    pcVar3 = "Nothing like that in heaven or earth.\n\r";
  }
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_oset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;
	int value;

	smash_tilde(argument);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set obj <object> <field> <value>\n\r", ch);
		send_to_char("  Field being one of:\n\r", ch);
		send_to_char("    value0 value1 value2 value3 value4 (v1-v4)\n\r", ch);
		send_to_char("    extra wear level weight cost timer\n\r", ch);
		return;
	}

	obj = get_obj_world(ch, arg1);

	if (obj == nullptr)
	{
		send_to_char("Nothing like that in heaven or earth.\n\r", ch);
		return;
	}

	/*
	 * Snarf the value (which need not be numeric).
	 */
	value = atoi(arg3);

	/*
	 * Set something.
	 */
	if (!str_cmp(arg2, "value0") || !str_cmp(arg2, "v0"))
	{
		/*	obj->value[0] = std::min(50,value); */
		obj->value[0] = value;
		return;
	}

	if (!str_cmp(arg2, "value1") || !str_cmp(arg2, "v1"))
	{
		obj->value[1] = value;
		return;
	}

	if (!str_cmp(arg2, "value2") || !str_cmp(arg2, "v2"))
	{
		obj->value[2] = value;
		return;
	}

	if (!str_cmp(arg2, "value3") || !str_cmp(arg2, "v3"))
	{
		obj->value[3] = value;
		return;
	}

	if (!str_cmp(arg2, "value4") || !str_cmp(arg2, "v4"))
	{
		obj->value[4] = value;
		return;
	}

	if (!str_prefix(arg2, "level"))
	{
		obj->level = value;
		return;
	}

	if (!str_prefix(arg2, "weight"))
	{
		obj->weight = value;
		return;
	}

	if (!str_prefix(arg2, "cost"))
	{
		obj->cost = value;
		return;
	}

	if (!str_prefix(arg2, "timer"))
	{
		obj->timer = value;
		return;
	}

	/*
	 * Generate usage message.
	 */
	do_oset(ch, "");
}